

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O1

void Gia_ManQuantDupConeSupp_rec
               (Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vCis,Vec_Int_t *vObjs,
               _func_int_void_ptr_int *pFuncCiToKeep,void *pData)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint Entry;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) {
LAB_002065aa:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  Entry = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if ((-1 < (int)Entry) && ((int)Entry < (p->vCopies).nSize)) {
    if (-1 < (p->vCopies).pArray[Entry & 0x7fffffff]) {
      return;
    }
    uVar9 = (uint)*(undefined8 *)pObj;
    if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
      pGVar6 = Gia_ManAppendObj(pNew);
      uVar2 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar1 = pNew->pObjs;
      if ((pGVar1 <= pGVar6) && (pGVar6 < pGVar1 + pNew->nObjs)) {
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar1) >> 2) * -0x55555555);
        pGVar1 = pNew->pObjs;
        if ((pGVar1 <= pGVar6) && (pGVar6 < pGVar1 + pNew->nObjs)) {
          iVar5 = (int)((long)pGVar6 - (long)pGVar1 >> 2);
          uVar9 = iVar5 * -0x55555555;
          iVar5 = iVar5 * 0x55555556;
          if (iVar5 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (pNew->nObjs <= (int)(uVar9 & 0x7fffffff)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          Gia_ManQuantSetSuppZero(pNew);
          if (-1 < (int)*(undefined8 *)pObj) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          iVar4 = (*pFuncCiToKeep)(pData,(uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff);
          if (iVar4 == 0) {
            Gia_ManQuantSetSuppCi(pNew,pGVar1 + (uVar9 & 0x7fffffff));
          }
          iVar4 = (p->vCopies).nSize;
          goto joined_r0x0020646a;
        }
      }
      goto LAB_002065aa;
    }
    if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaExist.c"
                    ,0xdb,
                    "void Gia_ManQuantDupConeSupp_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *, int (*)(void *, int), void *)"
                   );
    }
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(uVar9 & 0x1fffffff),vCis,vObjs,pFuncCiToKeep,pData);
    Gia_ManQuantDupConeSupp_rec
              (pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vCis,vObjs,
               pFuncCiToKeep,pData);
    uVar2 = *(ulong *)pObj;
    uVar9 = Entry - ((uint)uVar2 & 0x1fffffff);
    if ((-1 < (int)uVar9) && (iVar5 = (p->vCopies).nSize, (int)uVar9 < iVar5)) {
      uVar8 = (uint)(uVar2 >> 0x20);
      uVar7 = Entry - (uVar8 & 0x1fffffff);
      if ((-1 < (int)uVar7) && ((int)uVar7 < iVar5)) {
        piVar3 = (p->vCopies).pArray;
        uVar9 = piVar3[uVar9];
        if (((int)uVar9 < 0) || (uVar7 = piVar3[uVar7], (int)uVar7 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar5 = Gia_ManHashAnd(pNew,uVar9 ^ (uint)(uVar2 >> 0x1d) & 1,uVar7 ^ uVar8 >> 0x1d & 1);
        iVar4 = (p->vCopies).nSize;
        vCis = vObjs;
joined_r0x0020646a:
        if (iVar4 <= (int)Entry) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[Entry & 0x7fffffff] = iVar5;
        Vec_IntPush(vCis,Entry);
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManQuantDupConeSupp_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vCis, Vec_Int_t * vObjs, int(*pFuncCiToKeep)(void *, int), void * pData )
{
    int iLit0, iLit1, iObj = Gia_ObjId( p, pObj );
    int iLit = Gia_ObjCopyArray( p, iObj );
    if ( iLit >= 0 )
        return;
    if ( Gia_ObjIsCi(pObj) )
    {
        int iLit = Gia_ManAppendCi( pNew );
        Gia_Obj_t * pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
        Gia_ManQuantSetSuppZero( pNew );
        if ( !pFuncCiToKeep( pData, Gia_ObjCioId(pObj) ) )
        {
            //printf( "Collecting CI %d\n", Gia_ObjCioId(pObj)+1 );
            Gia_ManQuantSetSuppCi( pNew, pObjNew );
        }
        Gia_ObjSetCopyArray( p, iObj, iLit );
        Vec_IntPush( vCis, iObj );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin0(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    Gia_ManQuantDupConeSupp_rec( pNew, p, Gia_ObjFanin1(pObj), vCis, vObjs, pFuncCiToKeep, pData );
    iLit0 = Gia_ObjCopyArray( p, Gia_ObjFaninId0(pObj, iObj) );
    iLit1 = Gia_ObjCopyArray( p, Gia_ObjFaninId1(pObj, iObj) );
    iLit0 = Abc_LitNotCond( iLit0, Gia_ObjFaninC0(pObj) );
    iLit1 = Abc_LitNotCond( iLit1, Gia_ObjFaninC1(pObj) );
    iLit  = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    Gia_ObjSetCopyArray( p, iObj, iLit );
    Vec_IntPush( vObjs, iObj );
}